

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::relocate
          (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *this,qsizetype offset,
          ButtonInfo **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *in_RDI;
  ButtonInfo **unaff_retaddr;
  ButtonInfo *res;
  ButtonInfo *first;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<(anonymous_namespace)::ButtonInfo,long_long>
            (first,(longlong)in_RDI,(ButtonInfo *)0x4470a3);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<(anonymous_namespace)::ButtonInfo>,(anonymous_namespace)::ButtonInfo_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x98 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }